

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adig.c
# Opt level: O0

void print_rr(ares_dns_rr_t *rr)

{
  undefined4 uVar1;
  uint uVar2;
  undefined4 uVar3;
  long lVar4;
  undefined8 uVar5;
  ulong uStack_40;
  ares_dns_datatype_t datatype;
  size_t i;
  ares_dns_rr_key_t *keys;
  ulong uStack_28;
  ares_dns_rec_type_t rtype;
  size_t keys_cnt;
  size_t len;
  char *name;
  ares_dns_rr_t *rr_local;
  
  name = (char *)rr;
  len = ares_dns_rr_get_name(rr);
  keys_cnt = 0;
  uStack_28 = 0;
  uVar1 = ares_dns_rr_get_type(name);
  lVar4 = ares_dns_rr_get_keys(uVar1,&stack0xffffffffffffffd8);
  if (len != 0) {
    keys_cnt = strlen((char *)len);
    printf("%s.\t",len);
    if (keys_cnt < 0x18) {
      printf("\t");
    }
    if (global_config.opts.display_ttl != ARES_FALSE) {
      uVar2 = ares_dns_rr_get_ttl(name);
      printf("%u\t",(ulong)uVar2);
    }
    if (global_config.opts.display_class != ARES_FALSE) {
      uVar3 = ares_dns_rr_get_class(name);
      uVar5 = ares_dns_class_tostr(uVar3);
      printf("%s\t",uVar5);
    }
    uVar5 = ares_dns_rec_type_tostr(uVar1);
    printf("%s\t",uVar5);
    for (uStack_40 = 0; uStack_40 < uStack_28; uStack_40 = uStack_40 + 1) {
      uVar1 = ares_dns_rr_key_datatype(*(undefined4 *)(lVar4 + uStack_40 * 4));
      if (uStack_40 != 0) {
        printf(" ");
      }
      switch(uVar1) {
      case 1:
        print_addr((ares_dns_rr_t *)name,*(ares_dns_rr_key_t *)(lVar4 + uStack_40 * 4));
        break;
      case 2:
        print_addr6((ares_dns_rr_t *)name,*(ares_dns_rr_key_t *)(lVar4 + uStack_40 * 4));
        break;
      case 3:
        print_u8((ares_dns_rr_t *)name,*(ares_dns_rr_key_t *)(lVar4 + uStack_40 * 4));
        break;
      case 4:
        print_u16((ares_dns_rr_t *)name,*(ares_dns_rr_key_t *)(lVar4 + uStack_40 * 4));
        break;
      case 5:
        print_u32((ares_dns_rr_t *)name,*(ares_dns_rr_key_t *)(lVar4 + uStack_40 * 4));
        break;
      case 6:
        print_name((ares_dns_rr_t *)name,*(ares_dns_rr_key_t *)(lVar4 + uStack_40 * 4));
        break;
      case 7:
        print_str((ares_dns_rr_t *)name,*(ares_dns_rr_key_t *)(lVar4 + uStack_40 * 4));
        break;
      case 8:
        print_bin((ares_dns_rr_t *)name,*(ares_dns_rr_key_t *)(lVar4 + uStack_40 * 4));
        break;
      case 9:
        print_binp((ares_dns_rr_t *)name,*(ares_dns_rr_key_t *)(lVar4 + uStack_40 * 4));
        break;
      case 10:
        print_opts((ares_dns_rr_t *)name,*(ares_dns_rr_key_t *)(lVar4 + uStack_40 * 4));
        break;
      case 0xb:
        print_abinp((ares_dns_rr_t *)name,*(ares_dns_rr_key_t *)(lVar4 + uStack_40 * 4));
      }
    }
    printf("\n");
  }
  return;
}

Assistant:

static void print_rr(const ares_dns_rr_t *rr)
{
  const char              *name     = ares_dns_rr_get_name(rr);
  size_t                   len      = 0;
  size_t                   keys_cnt = 0;
  ares_dns_rec_type_t      rtype    = ares_dns_rr_get_type(rr);
  const ares_dns_rr_key_t *keys     = ares_dns_rr_get_keys(rtype, &keys_cnt);
  size_t                   i;

  if (name == NULL) {
    return;
  }

  len = strlen(name);

  printf("%s.\t", name);
  if (len < 24) {
    printf("\t");
  }

  if (global_config.opts.display_ttl) {
    printf("%u\t", ares_dns_rr_get_ttl(rr));
  }

  if (global_config.opts.display_class) {
    printf("%s\t", ares_dns_class_tostr(ares_dns_rr_get_class(rr)));
  }

  printf("%s\t", ares_dns_rec_type_tostr(rtype));

  /* Output params here */
  for (i = 0; i < keys_cnt; i++) {
    ares_dns_datatype_t datatype = ares_dns_rr_key_datatype(keys[i]);
    if (i != 0) {
      printf(" ");
    }

    switch (datatype) {
      case ARES_DATATYPE_INADDR:
        print_addr(rr, keys[i]);
        break;
      case ARES_DATATYPE_INADDR6:
        print_addr6(rr, keys[i]);
        break;
      case ARES_DATATYPE_U8:
        print_u8(rr, keys[i]);
        break;
      case ARES_DATATYPE_U16:
        print_u16(rr, keys[i]);
        break;
      case ARES_DATATYPE_U32:
        print_u32(rr, keys[i]);
        break;
      case ARES_DATATYPE_NAME:
        print_name(rr, keys[i]);
        break;
      case ARES_DATATYPE_STR:
        print_str(rr, keys[i]);
        break;
      case ARES_DATATYPE_BIN:
        print_bin(rr, keys[i]);
        break;
      case ARES_DATATYPE_BINP:
        print_binp(rr, keys[i]);
        break;
      case ARES_DATATYPE_ABINP:
        print_abinp(rr, keys[i]);
        break;
      case ARES_DATATYPE_OPT:
        print_opts(rr, keys[i]);
        break;
    }
  }

  printf("\n");
}